

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O3

bool __thiscall ON_PolyCurve::IsPlanar(ON_PolyCurve *this,ON_Plane *plane,double tolerance)

{
  uint uVar1;
  ON_Curve *pOVar2;
  double dVar3;
  ON_3dPoint from_pt;
  ON_3dPoint to_pt;
  bool bVar4;
  int iVar5;
  double *pdVar6;
  char cVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ON_Plane *pOVar12;
  ON_Plane *pOVar13;
  uint uVar14;
  byte bVar15;
  undefined4 uVar16;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double in_XMM1_Qa;
  ON_3dPoint best_Y;
  ON_3dVector Y;
  ON_3dVector X;
  ON_3dPoint R;
  ON_Line line;
  ON_Interval d;
  ON_Plane test_plane;
  double local_1b8;
  ON_3dPoint local_1a8;
  ON_3dPoint local_190;
  ON_3dVector local_178;
  ON_3dPoint local_158;
  double local_140;
  ON_Line local_138;
  ON_Interval local_108;
  double local_f8;
  ulong uStack_f0;
  ON_3dPoint local_e0;
  ON_3dPoint local_c8;
  ON_Plane local_b0;
  
  bVar15 = 0;
  iVar5 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])();
  if (iVar5 == 2) {
    bVar4 = ON_Curve::IsPlanar(&this->super_ON_Curve,plane,tolerance);
    return bVar4;
  }
  ON_Plane::ON_Plane(&local_b0);
  uVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  if (0 < (int)uVar1) {
    pOVar2 = *(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a;
    uVar16 = SUB84(tolerance,0);
    if (pOVar2 != (ON_Curve *)0x0 && uVar1 == 1) {
      iVar5 = (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x32])
                        (uVar16,pOVar2,plane);
      cVar7 = (char)iVar5;
      goto LAB_00586303;
    }
    if (uVar1 != 1) {
      iVar5 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2e])
                        (uVar16,this);
      if ((char)iVar5 != '\0') {
        cVar7 = '\x01';
        if (plane != (ON_Plane *)0x0) {
          ON_Curve::PointAtStart(&local_c8,&this->super_ON_Curve);
          ON_Curve::PointAtEnd(&local_e0,&this->super_ON_Curve);
          from_pt.y = local_c8.y;
          from_pt.x = local_c8.x;
          from_pt.z = local_c8.z;
          to_pt.y = local_e0.y;
          to_pt.x = local_e0.x;
          to_pt.z = local_e0.z;
          ON_Line::ON_Line(&local_138,from_pt,to_pt);
          bVar4 = ON_Line::InPlane(&local_138,plane,tolerance);
          if (!bVar4) {
            ON_Line::InPlane(&local_138,plane,0.0);
          }
          ON_Line::~ON_Line(&local_138);
        }
        goto LAB_00586303;
      }
      (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
      local_108.m_t[1] = in_XMM1_Qa;
      pdVar6 = ON_Interval::operator[](&local_108,0);
      bVar4 = ON_Curve::Ev1Der(&this->super_ON_Curve,*pdVar6,&local_138.from,&local_178,0,(int *)0x0
                              );
      if ((bVar4) && (bVar4 = ON_3dVector::Unitize(&local_178), bVar4)) {
        ON_3dPoint::operator+(&local_1a8,&local_138.from,&local_178);
        local_1a8.z = ON_3dPoint::Origin.z;
        local_1a8.x = ON_3dPoint::Origin.x;
        local_1a8.y = ON_3dPoint::Origin.y;
        local_1b8 = 1.0;
        uVar14 = 2;
        do {
          local_140 = (double)(int)uVar14;
          uVar10 = 1;
          do {
            dVar3 = ON_Interval::ParameterAt(&local_108,(double)(int)uVar10 / local_140);
            ON_Curve::PointAt(&local_190,&this->super_ON_Curve,dVar3);
            local_158.z = local_190.z;
            local_158.x = local_190.x;
            local_158.y = local_190.y;
            ON_3dPoint::operator-((ON_3dVector *)&local_190,&local_158,&local_138.from);
            bVar4 = ON_3dVector::Unitize((ON_3dVector *)&local_190);
            if (bVar4) {
              iVar5 = ON_3dVector::IsParallelTo
                                (&local_178,(ON_3dVector *)&local_190,0.017453292519943295);
              if (iVar5 == 0) {
                bVar4 = ON_Plane::CreateFromFrame
                                  (&local_b0,&local_138.from,&local_178,(ON_3dVector *)&local_190);
                if (bVar4) goto LAB_00586618;
              }
              else {
                in_XMM1_Qa = ON_3dVector::operator*(&local_178,(ON_3dVector *)&local_190);
                in_XMM1_Qa = ABS(in_XMM1_Qa);
                uStack_f0 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc) & 0x7fffffffffffffff;
                local_f8 = in_XMM1_Qa;
                if (in_XMM1_Qa < local_1b8) {
                  ON_3dPoint::operator=(&local_1a8,(ON_3dVector *)&local_190);
                  local_1b8 = local_f8;
                }
              }
            }
            uVar10 = uVar10 + 2;
          } while (uVar10 < uVar14);
          bVar4 = uVar14 < 0xf;
          uVar14 = uVar14 + 2;
        } while (bVar4);
        if (local_1b8 < 1.0) {
          ON_3dVector::ON_3dVector((ON_3dVector *)&local_190,&local_1a8);
          bVar4 = ON_Plane::CreateFromFrame
                            (&local_b0,&local_138.from,&local_178,(ON_3dVector *)&local_190);
          if (bVar4) {
LAB_00586618:
            iVar5 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x33]
                    )(uVar16,this,&local_b0);
            cVar7 = (char)iVar5;
            if (cVar7 == '\x01' && plane != (ON_Plane *)0x0) {
              pOVar12 = &local_b0;
              pOVar13 = plane;
              for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
                (pOVar13->origin).x = (pOVar12->origin).x;
                pOVar12 = (ON_Plane *)((long)pOVar12 + ((ulong)bVar15 * -2 + 1) * 8);
                pOVar13 = (ON_Plane *)((long)pOVar13 + (ulong)bVar15 * -0x10 + 8);
              }
              iVar5 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                        [0x34])(this);
              cVar7 = '\x01';
              if (((char)iVar5 != '\0') &&
                 (iVar5 = ON_ClosedCurveOrientation(&this->super_ON_Curve,plane), iVar5 < 0)) {
                ON_Plane::Flip(plane);
              }
            }
            goto LAB_00586303;
          }
        }
      }
      bVar4 = ON_Curve::Ev1Der(&this->super_ON_Curve,*(this->m_t).m_a,&local_138.from,&local_178,0,
                               (int *)0x0);
      if (bVar4) {
        bVar4 = ON_3dVector::Unitize(&local_178);
        if (!bVar4) {
          (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
          local_108.m_t[1] = in_XMM1_Qa;
          dVar3 = ON_Interval::ParameterAt(&local_108,0.5);
          ON_Curve::PointAt(&local_190,&this->super_ON_Curve,dVar3);
          ON_3dPoint::operator-((ON_3dVector *)&local_1a8,&local_190,&local_138.from);
          local_178.z = local_1a8.z;
          local_178.x = local_1a8.x;
          local_178.y = local_1a8.y;
          bVar4 = ON_3dVector::Unitize(&local_178);
          if (!bVar4) goto LAB_00586301;
        }
        uVar11 = 2;
        if (2 < (int)uVar1) {
          uVar11 = (ulong)uVar1;
        }
        uVar9 = 1;
        do {
          pOVar2 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar9];
          if (pOVar2 != (ON_Curve *)0x0) {
            (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(pOVar2);
            local_190.y = in_XMM1_Qa;
            dVar3 = ON_Interval::ParameterAt((ON_Interval *)&local_190,0.5);
            ON_Curve::PointAt(&local_1a8,pOVar2,dVar3);
            local_158.z = local_1a8.z;
            local_158.x = local_1a8.x;
            local_158.y = local_1a8.y;
            ON_3dPoint::operator-((ON_3dVector *)&local_1a8,&local_158,&local_138.from);
            bVar4 = ON_Plane::CreateFromFrame
                              (&local_b0,&local_138.from,&local_178,(ON_3dVector *)&local_1a8);
            if (bVar4) goto LAB_00586618;
          }
          uVar9 = uVar9 + 1;
        } while (uVar11 != uVar9);
      }
    }
  }
LAB_00586301:
  cVar7 = '\0';
LAB_00586303:
  ON_Plane::~ON_Plane(&local_b0);
  return (bool)cVar7;
}

Assistant:

bool
ON_PolyCurve::IsPlanar(
      ON_Plane* plane, // if not nullptr and true is returned, then plane parameters
                         // are filled in
      double tolerance // tolerance to use when checking linearity
      ) const
{
  if ( Dimension() == 2 )
  {
    return ON_Curve::IsPlanar(plane,tolerance);
  }

  bool rc = false;
  ON_Plane test_plane;
  const int count = Count();
  const ON_Curve* crv = FirstSegmentCurve();
  if ( count == 1 && crv )
    rc = crv->IsPlanar( plane, tolerance );
  else if ( count > 1 )
  {
    if ( IsLinear(tolerance) )
    {
      if ( plane )
      {
        ON_Line line(PointAtStart(), PointAtEnd() );
        if ( !line.InPlane( *plane, tolerance ) )
          line.InPlane( *plane, 0.0 );
      }
      return true;
    }
    if ( !GetTestPlane( *this, test_plane ) )
    {
      // 5 May 2006 Dale Lear
      //   Added additional attempts to get a test_plane
      //   for poorly parameterized polycurves. (RR 20057 fix).
      ON_3dPoint P, Q;
      ON_3dVector X;
      if (!Ev1Der(m_t[0],P,X))
        return false;

      if ( !X.Unitize() )
      {
        X = PointAt(Domain().ParameterAt(0.5)) - P;
        if ( !X.Unitize() )
          return false;
      }

      int i;
      for ( i = 1; i < count; i++ )
      {
        if ( m_segment[i] )
        {
          Q = m_segment[i]->PointAt(m_segment[i]->Domain().ParameterAt(0.5));
          if ( test_plane.CreateFromFrame(P,X,Q-P) )
            break;
        }
      }
      if ( i >= count )
        return false;
    }
    rc = IsInPlane( test_plane, tolerance );
    if (rc && plane)
      *plane = test_plane;

    // RH-75060 GBA 9-June-23 
     // For a planar simple closed curve we should return the plane
     // whose orientation that matches the curve orientation.
    if (rc && plane && IsClosed())
    {
      if (ON_ClosedCurveOrientation(*this, *plane) < 0)
        plane->Flip();
    }
  }
  return rc;
}